

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler_test.cc
# Opt level: O0

double AndersonDarlingTest(int n,double *random_sample)

{
  ostream *poVar1;
  double dVar2;
  double p;
  string local_40;
  double local_20;
  double ad_statistic;
  double *random_sample_local;
  int n_local;
  
  ad_statistic = (double)random_sample;
  random_sample_local._4_4_ = n;
  local_20 = AndersonDarlingStatistic(n,random_sample);
  poVar1 = std::operator<<((ostream *)&std::cerr,"\n");
  StringPrintf_abi_cxx11_
            (&local_40,"AD stat = %f, n=%d\n",local_20,(ulong)random_sample_local._4_4_);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  dVar2 = AndersonDarlingPValue(random_sample_local._4_4_,local_20);
  return dVar2;
}

Assistant:

double AndersonDarlingTest(int n, double* random_sample) {
  double ad_statistic = AndersonDarlingStatistic(n, random_sample);
  LOG(INFO) << StringPrintf("AD stat = %f, n=%d\n", ad_statistic, n);
  double p = AndersonDarlingPValue(n, ad_statistic);
  return p;
}